

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int should_keep_alive(mg_connection *conn)

{
  int iVar1;
  char *pcVar2;
  char *header;
  char *http_version;
  mg_connection *conn_local;
  
  if ((conn == (mg_connection *)0x0) || (conn->must_close != 0)) {
    conn_local._4_4_ = 0;
  }
  else {
    iVar1 = mg_strcasecmp(conn->dom_ctx->config[10],"yes");
    if (iVar1 == 0) {
      pcVar2 = mg_get_header(conn,"Connection");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = get_http_version(conn);
        if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,"1.1"), iVar1 == 0)) {
          return 1;
        }
        conn_local._4_4_ = 0;
      }
      else {
        iVar1 = header_has_option(pcVar2,"keep-alive");
        if (iVar1 == 0) {
          conn_local._4_4_ = 0;
        }
        else {
          conn_local._4_4_ = 1;
        }
      }
    }
    else {
      conn_local._4_4_ = 0;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
should_keep_alive(const struct mg_connection *conn)
{
	const char *http_version;
	const char *header;

	/* First satisfy needs of the server */
	if ((conn == NULL) || conn->must_close) {
		/* Close, if civetweb framework needs to close */
		return 0;
	}

	if (mg_strcasecmp(conn->dom_ctx->config[ENABLE_KEEP_ALIVE], "yes") != 0) {
		/* Close, if keep alive is not enabled */
		return 0;
	}

	/* Check explicit wish of the client */
	header = mg_get_header(conn, "Connection");
	if (header) {
		/* If there is a connection header from the client, obey */
		if (header_has_option(header, "keep-alive")) {
			return 1;
		}
		return 0;
	}

	/* Use default of the standard */
	http_version = get_http_version(conn);
	if (http_version && (0 == strcmp(http_version, "1.1"))) {
		/* HTTP 1.1 default is keep alive */
		return 1;
	}

	/* HTTP 1.0 (and earlier) default is to close the connection */
	return 0;
}